

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::RemoveFromHash(AActor *this)

{
  AActor *this_local;
  
  if ((this->tid != 0) && (this->iprev != (AActor **)0x0)) {
    *this->iprev = this->inext;
    if (this->inext != (AActor *)0x0) {
      this->inext->iprev = this->iprev;
    }
    this->iprev = (AActor **)0x0;
    this->inext = (AActor *)0x0;
  }
  this->tid = 0;
  return;
}

Assistant:

void AActor::RemoveFromHash ()
{
	if (tid != 0 && iprev)
	{
		*iprev = inext;
		if (inext)
		{
			inext->iprev = iprev;
		}
		iprev = NULL;
		inext = NULL;
	}
	tid = 0;
}